

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  const_iterator __position;
  const_iterator __position_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  string *psVar6;
  cmConditionEvaluator *pcVar7;
  cmConditionEvaluator *pcVar8;
  ostream *poVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  PolicyID id;
  _Self __tmp_1;
  iterator iVar11;
  iterator iVar12;
  cmExpandedCommandArgument *pcVar13;
  cmConditionEvaluator *pcVar14;
  cmMakefile *pcVar15;
  _Self __tmp;
  _List_node_base *p_Var16;
  _Self __tmp_2;
  int reducible;
  iterator local_2f8;
  allocator local_2e9;
  iterator local_2e8;
  iterator arg;
  char *def;
  string local_2d0;
  string *local_2b0;
  MessageType *local_2a8;
  _List_node_base *local_2a0;
  string def_buf;
  RegularExpression regEntry;
  ostringstream error;
  undefined4 uStack_1a4;
  
  def_buf._M_dataplus._M_p = (pointer)&def_buf.field_2;
  def_buf._M_string_length = 0;
  def_buf.field_2._M_local_buf[0] = '\0';
  local_2b0 = errorString;
  local_2a8 = status;
  do {
    reducible = 0;
    p_Var16 = (newArgs->
              super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    while (arg._M_node = p_Var16, p_Var16 != (_List_node_base *)newArgs) {
      __position._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_2f8._M_node = __position._M_node;
      local_2e8._M_node = __position._M_node;
      if (((__position._M_node != (_List_node_base *)newArgs) &&
          (__position_00._M_node = (__position._M_node)->_M_next,
          local_2f8._M_node = __position_00._M_node,
          __position_00._M_node != (_List_node_base *)newArgs)) &&
         (bVar1 = IsKeyword(this,&keyMATCHES_abi_cxx11_,
                            (cmExpandedCommandArgument *)(__position._M_node + 1)), bVar1)) {
        local_2a0 = arg._M_node;
        pcVar13 = (cmExpandedCommandArgument *)(arg._M_node + 1);
        pcVar4 = GetVariableOrString(this,pcVar13);
        def = pcVar4;
        pcVar5 = cmExpandedCommandArgument::c_str(pcVar13);
        if (pcVar4 != pcVar5) {
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,13ul>
                            (psVar6,(char (*) [13])"CMAKE_MATCH_");
          if (bVar1) {
            std::__cxx11::string::assign((char *)&def_buf);
            def = def_buf._M_dataplus._M_p;
          }
        }
        pcVar4 = cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(__position_00._M_node + 1));
        cmMakefile::ClearMatches(this->Makefile);
        regEntry.program = (char *)0x0;
        bVar1 = cmsys::RegularExpression::compile(&regEntry,pcVar4);
        if (bVar1) {
          bVar2 = cmsys::RegularExpression::find(&regEntry,def);
          if (bVar2) {
            cmMakefile::StoreMatches(this->Makefile,&regEntry);
            std::__cxx11::string::string((string *)&local_2d0,"1",&local_2e9);
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)&error,&local_2d0,true);
          }
          else {
            std::__cxx11::string::string((string *)&local_2d0,"0",&local_2e9);
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      ((cmExpandedCommandArgument *)&error,&local_2d0,true);
          }
          cmExpandedCommandArgument::operator=(pcVar13,(cmExpandedCommandArgument *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::erase(newArgs,__position_00);
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::erase(newArgs,__position);
          local_2e8._M_node = local_2a0;
          if ((local_2a0 != (_List_node_base *)newArgs) &&
             (local_2e8._M_node = local_2a0->_M_next, local_2f8._M_node = local_2e8._M_node,
             local_2e8._M_node != (_List_node_base *)newArgs)) {
            local_2f8._M_node = (local_2e8._M_node)->_M_next;
          }
          reducible = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar9 = std::operator<<((ostream *)&error,"Regular expression \"");
          poVar9 = std::operator<<(poVar9,pcVar4);
          std::operator<<(poVar9,"\" cannot compile");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          *local_2a8 = FATAL_ERROR;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
        }
        cmsys::RegularExpression::~RegularExpression(&regEntry);
        if (!bVar1) goto LAB_00403a28;
      }
      iVar12._M_node = arg._M_node;
      iVar11._M_node = local_2e8._M_node;
      if (local_2e8._M_node != (_List_node_base *)newArgs) {
        pcVar13 = (cmExpandedCommandArgument *)(arg._M_node + 1);
        bVar1 = IsKeyword(this,&keyMATCHES_abi_cxx11_,pcVar13);
        if (bVar1) {
          std::__cxx11::string::string((string *)&regEntry,"0",(allocator *)&local_2d0);
          cmExpandedCommandArgument::cmExpandedCommandArgument
                    ((cmExpandedCommandArgument *)&error,(string *)&regEntry,true);
          cmExpandedCommandArgument::operator=(pcVar13,(cmExpandedCommandArgument *)&error);
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&regEntry);
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::erase(newArgs,(const_iterator)iVar11._M_node);
          local_2e8._M_node = iVar12._M_node;
          if ((iVar12._M_node != (_List_node_base *)newArgs) &&
             (local_2e8._M_node = (iVar12._M_node)->_M_next, local_2f8._M_node = local_2e8._M_node,
             local_2e8._M_node != (_List_node_base *)newArgs)) {
            local_2f8._M_node = (local_2e8._M_node)->_M_next;
          }
          reducible = 1;
          iVar11._M_node = local_2e8._M_node;
        }
      }
      iVar12._M_node = local_2f8._M_node;
      if ((iVar11._M_node != (_List_node_base *)newArgs) &&
         (local_2f8._M_node != (_List_node_base *)newArgs)) {
        pcVar8 = (cmConditionEvaluator *)(iVar11._M_node + 1);
        bVar1 = IsKeyword(this,&keyLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8);
        if ((bVar1) ||
           ((((bVar1 = IsKeyword(this,&keyLESS_EQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8)
              , bVar1 ||
              (bVar1 = IsKeyword(this,&keyGREATER_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8),
              bVar1)) ||
             (bVar1 = IsKeyword(this,&keyGREATER_EQUAL_abi_cxx11_,
                                (cmExpandedCommandArgument *)pcVar8), bVar1)) ||
            (bVar1 = IsKeyword(this,&keyEQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8), bVar1
            )))) {
          def = GetVariableOrString(this,(cmExpandedCommandArgument *)(arg._M_node + 1));
          pcVar7 = (cmConditionEvaluator *)
                   GetVariableOrString(this,(cmExpandedCommandArgument *)(iVar12._M_node + 1));
          bVar1 = false;
          pcVar14 = (cmConditionEvaluator *)def;
          iVar3 = __isoc99_sscanf(def,"%lg",&error);
          if (iVar3 == 1) {
            bVar1 = false;
            iVar3 = __isoc99_sscanf(pcVar7,"%lg",&regEntry);
            pcVar14 = pcVar7;
            if (iVar3 == 1) {
              pcVar14 = pcVar8;
              bVar1 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar8,&keyLESS_abi_cxx11_);
              if (bVar1) {
                bVar1 = (double)regEntry.startp[0] == (double)CONCAT44(uStack_1a4,_error);
                bVar2 = (double)regEntry.startp[0] < (double)CONCAT44(uStack_1a4,_error);
LAB_0040341f:
                bVar1 = !bVar2 && !bVar1;
              }
              else {
                pcVar14 = pcVar8;
                bVar1 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar8,&keyLESS_EQUAL_abi_cxx11_);
                if (bVar1) {
                  bVar1 = (double)regEntry.startp[0] < (double)CONCAT44(uStack_1a4,_error);
                  pcVar8 = pcVar14;
                }
                else {
                  pcVar14 = pcVar8;
                  bVar1 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar8,&keyGREATER_abi_cxx11_);
                  if (bVar1) {
                    bVar1 = (double)CONCAT44(uStack_1a4,_error) == (double)regEntry.startp[0];
                    bVar2 = (double)CONCAT44(uStack_1a4,_error) < (double)regEntry.startp[0];
                    goto LAB_0040341f;
                  }
                  bVar1 = cmExpandedCommandArgument::operator==
                                    ((cmExpandedCommandArgument *)pcVar8,
                                     &keyGREATER_EQUAL_abi_cxx11_);
                  if (!bVar1) {
                    bVar1 = (bool)(-((double)CONCAT44(uStack_1a4,_error) ==
                                    (double)regEntry.startp[0]) & 1);
                    pcVar14 = pcVar8;
                    goto LAB_00403452;
                  }
                  bVar1 = (double)CONCAT44(uStack_1a4,_error) < (double)regEntry.startp[0];
                }
                bVar1 = !bVar1;
                pcVar14 = pcVar8;
              }
            }
          }
LAB_00403452:
          HandleBinaryOp(pcVar14,bVar1,&reducible,&arg,newArgs,&local_2e8,&local_2f8);
        }
      }
      iVar12._M_node = local_2e8._M_node;
      iVar11._M_node = local_2f8._M_node;
      if ((local_2e8._M_node != (_List_node_base *)newArgs) &&
         (local_2f8._M_node != (_List_node_base *)newArgs)) {
        pcVar8 = (cmConditionEvaluator *)(local_2e8._M_node + 1);
        bVar1 = IsKeyword(this,&keySTRLESS_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8);
        if ((((bVar1) ||
             ((bVar1 = IsKeyword(this,&keySTRLESS_EQUAL_abi_cxx11_,
                                 (cmExpandedCommandArgument *)pcVar8), bVar1 ||
              (bVar1 = IsKeyword(this,&keySTRGREATER_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8)
              , bVar1)))) ||
            (bVar1 = IsKeyword(this,&keySTRGREATER_EQUAL_abi_cxx11_,
                               (cmExpandedCommandArgument *)pcVar8), bVar1)) ||
           (bVar1 = IsKeyword(this,&keySTREQUAL_abi_cxx11_,(cmExpandedCommandArgument *)pcVar8),
           bVar1)) {
          def = GetVariableOrString(this,(cmExpandedCommandArgument *)(arg._M_node + 1));
          pcVar4 = GetVariableOrString(this,(cmExpandedCommandArgument *)(iVar11._M_node + 1));
          iVar3 = strcmp(def,pcVar4);
          pcVar14 = pcVar8;
          bVar1 = cmExpandedCommandArgument::operator==
                            ((cmExpandedCommandArgument *)pcVar8,&keySTRLESS_abi_cxx11_);
          if (bVar1) {
            bVar1 = SUB41((uint)iVar3 >> 0x1f,0);
            pcVar8 = pcVar14;
          }
          else {
            pcVar14 = pcVar8;
            bVar1 = cmExpandedCommandArgument::operator==
                              ((cmExpandedCommandArgument *)pcVar8,&keySTRLESS_EQUAL_abi_cxx11_);
            if (bVar1) {
              bVar1 = iVar3 < 1;
              pcVar8 = pcVar14;
            }
            else {
              pcVar14 = pcVar8;
              bVar1 = cmExpandedCommandArgument::operator==
                                ((cmExpandedCommandArgument *)pcVar8,&keySTRGREATER_abi_cxx11_);
              if (bVar1) {
                bVar1 = 0 < iVar3;
                pcVar8 = pcVar14;
              }
              else {
                bVar1 = cmExpandedCommandArgument::operator==
                                  ((cmExpandedCommandArgument *)pcVar8,
                                   &keySTRGREATER_EQUAL_abi_cxx11_);
                if (bVar1) {
                  bVar1 = -1 < iVar3;
                }
                else {
                  bVar1 = iVar3 == 0;
                }
              }
            }
          }
          HandleBinaryOp(pcVar8,bVar1,&reducible,&arg,newArgs,&local_2e8,&local_2f8);
          iVar12._M_node = local_2e8._M_node;
        }
      }
      iVar11._M_node = local_2f8._M_node;
      if ((iVar12._M_node != (_List_node_base *)newArgs) &&
         (local_2f8._M_node != (_List_node_base *)newArgs)) {
        pcVar13 = (cmExpandedCommandArgument *)(iVar12._M_node + 1);
        bVar1 = IsKeyword(this,&keyVERSION_LESS_abi_cxx11_,pcVar13);
        if (((bVar1) ||
            (((bVar1 = IsKeyword(this,&keyVERSION_LESS_EQUAL_abi_cxx11_,pcVar13), bVar1 ||
              (bVar1 = IsKeyword(this,&keyVERSION_GREATER_abi_cxx11_,pcVar13), bVar1)) ||
             (bVar1 = IsKeyword(this,&keyVERSION_GREATER_EQUAL_abi_cxx11_,pcVar13), bVar1)))) ||
           (bVar1 = IsKeyword(this,&keyVERSION_EQUAL_abi_cxx11_,pcVar13), bVar1)) {
          def = GetVariableOrString(this,(cmExpandedCommandArgument *)(arg._M_node + 1));
          pcVar4 = GetVariableOrString(this,(cmExpandedCommandArgument *)(iVar11._M_node + 1));
          bVar1 = cmExpandedCommandArgument::operator==(pcVar13,&keyVERSION_LESS_abi_cxx11_);
          pcVar8 = (cmConditionEvaluator *)0x2;
          if (!bVar1) {
            bVar1 = cmExpandedCommandArgument::operator==(pcVar13,&keyVERSION_LESS_EQUAL_abi_cxx11_)
            ;
            pcVar8 = (cmConditionEvaluator *)0x3;
            if (!bVar1) {
              bVar1 = cmExpandedCommandArgument::operator==(pcVar13,&keyVERSION_GREATER_abi_cxx11_);
              pcVar8 = (cmConditionEvaluator *)0x4;
              if (!bVar1) {
                bVar1 = cmExpandedCommandArgument::operator==
                                  (pcVar13,&keyVERSION_GREATER_EQUAL_abi_cxx11_);
                pcVar8 = (cmConditionEvaluator *)(ulong)((uint)bVar1 * 4 + 1);
              }
            }
          }
          bVar1 = cmSystemTools::VersionCompare((CompareOp)pcVar8,def,pcVar4);
          HandleBinaryOp(pcVar8,bVar1,&reducible,&arg,newArgs,&local_2e8,&local_2f8);
        }
      }
      iVar12._M_node = local_2e8._M_node;
      iVar11._M_node = local_2f8._M_node;
      if (((local_2e8._M_node != (_List_node_base *)newArgs) &&
          (local_2f8._M_node != (_List_node_base *)newArgs)) &&
         (bVar1 = IsKeyword(this,&keyIS_NEWER_THAN_abi_cxx11_,
                            (cmExpandedCommandArgument *)(local_2e8._M_node + 1)), bVar1)) {
        _error = 0;
        pcVar8 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(arg._M_node + 1));
        psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(iVar11._M_node + 1));
        bVar1 = cmsys::SystemTools::FileTimeCompare((string *)pcVar8,psVar6,(int *)&error);
        HandleBinaryOp(pcVar8,_error < 2 || !bVar1,&reducible,&arg,newArgs,&local_2e8,&local_2f8);
        iVar12._M_node = local_2e8._M_node;
      }
      iVar11._M_node = local_2f8._M_node;
      if (((iVar12._M_node != (_List_node_base *)newArgs) &&
          (local_2f8._M_node != (_List_node_base *)newArgs)) &&
         (bVar1 = IsKeyword(this,&keyIN_LIST_abi_cxx11_,
                            (cmExpandedCommandArgument *)(iVar12._M_node + 1)), bVar1)) {
        if (this->Policy57Status < NEW) {
          if (this->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&regEntry,(cmPolicies *)0x39,id);
            poVar9 = std::operator<<((ostream *)&error,(string *)&regEntry);
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&regEntry);
            std::operator<<((ostream *)&error,
                            "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                           );
            pcVar15 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar15,AUTHOR_WARNING,(string *)&regEntry);
            std::__cxx11::string::~string((string *)&regEntry);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
          }
        }
        else {
          def = GetVariableOrString(this,(cmExpandedCommandArgument *)(arg._M_node + 1));
          pcVar15 = this->Makefile;
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(iVar11._M_node + 1));
          pcVar4 = cmMakefile::GetDefinition(pcVar15,psVar6);
          if (pcVar4 == (char *)0x0) {
            bVar1 = false;
          }
          else {
            regEntry.startp[0] = (char *)0x0;
            regEntry.startp[1] = (char *)0x0;
            regEntry.startp[2] = (char *)0x0;
            std::__cxx11::string::string((string *)&error,pcVar4,(allocator *)&local_2d0);
            cmSystemTools::ExpandListArgument
                      ((string *)&error,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&regEntry,true);
            std::__cxx11::string::~string((string *)&error);
            _Var10 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                               (regEntry.startp[0],regEntry.startp[1],&def);
            bVar1 = _Var10._M_current !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    regEntry.startp[1];
            pcVar15 = (cmMakefile *)&regEntry;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pcVar15);
          }
          HandleBinaryOp((cmConditionEvaluator *)pcVar15,bVar1,&reducible,&arg,newArgs,&local_2e8,
                         &local_2f8);
        }
      }
      p_Var16 = (arg._M_node)->_M_next;
    }
  } while (reducible != 0);
LAB_00403a28:
  std::__cxx11::string::~string((string *)&def_buf);
  return p_Var16 == (_List_node_base *)newArgs;
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        cmake::MessageType& status)
{
  int reducible;
  std::string def_buf;
  const char* def;
  const char* def2;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          IsKeyword(keyMATCHES, *argP1)) {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_")) {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
        }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if (!regEntry.compile(rex)) {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = cmake::FATAL_ERROR;
          return false;
        }
        if (regEntry.find(def)) {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyMATCHES, *arg)) {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyLESS, *argP1) ||
           this->IsKeyword(keyLESS_EQUAL, *argP1) ||
           this->IsKeyword(keyGREATER, *argP1) ||
           this->IsKeyword(keyGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyEQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if (sscanf(def, "%lg", &lhs) != 1 || sscanf(def2, "%lg", &rhs) != 1) {
          result = false;
        } else if (*(argP1) == keyLESS) {
          result = (lhs < rhs);
        } else if (*(argP1) == keyLESS_EQUAL) {
          result = (lhs <= rhs);
        } else if (*(argP1) == keyGREATER) {
          result = (lhs > rhs);
        } else if (*(argP1) == keyGREATER_EQUAL) {
          result = (lhs >= rhs);
        } else {
          result = (lhs == rhs);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keySTRLESS, *argP1) ||
           this->IsKeyword(keySTRLESS_EQUAL, *argP1) ||
           this->IsKeyword(keySTRGREATER, *argP1) ||
           this->IsKeyword(keySTRGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keySTREQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def, def2);
        bool result;
        if (*(argP1) == keySTRLESS) {
          result = (val < 0);
        } else if (*(argP1) == keySTRLESS_EQUAL) {
          result = (val <= 0);
        } else if (*(argP1) == keySTRGREATER) {
          result = (val > 0);
        } else if (*(argP1) == keySTRGREATER_EQUAL) {
          result = (val >= 0);
        } else // strequal
        {
          result = (val == 0);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyVERSION_LESS, *argP1) ||
           this->IsKeyword(keyVERSION_LESS_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_EQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op;
        if (*argP1 == keyVERSION_LESS) {
          op = cmSystemTools::OP_LESS;
        } else if (*argP1 == keyVERSION_LESS_EQUAL) {
          op = cmSystemTools::OP_LESS_EQUAL;
        } else if (*argP1 == keyVERSION_GREATER) {
          op = cmSystemTools::OP_GREATER;
        } else if (*argP1 == keyVERSION_GREATER_EQUAL) {
          op = cmSystemTools::OP_GREATER_EQUAL;
        } else { // version_equal
          op = cmSystemTools::OP_EQUAL;
        }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIS_NEWER_THAN, *argP1)) {
        int fileIsNewer = 0;
        bool success = cmSystemTools::FileTimeCompare(
          arg->GetValue(), (argP2)->GetValue(), &fileIsNewer);
        this->HandleBinaryOp(
          (!success || fileIsNewer == 1 || fileIsNewer == 0), reducible, arg,
          newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIN_LIST, *argP1)) {
        if (this->Policy57Status != cmPolicies::OLD &&
            this->Policy57Status != cmPolicies::WARN) {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if (def2) {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
          }

          this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
        } else if (this->Policy57Status == cmPolicies::WARN) {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
          e << "IN_LIST will be interpreted as an operator "
               "when the policy is set to NEW.  "
               "Since the policy is not set the OLD behavior will be used.";

          this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      }

      ++arg;
    }
  } while (reducible);
  return true;
}